

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  ImVec2 *in_RDI;
  float _x;
  float _y;
  float a;
  int i;
  ImVec2 *local_20;
  ImVec2 local_18;
  float local_10;
  int local_c;
  
  ImVec2::ImVec2(in_RDI);
  ImVec4::ImVec4((ImVec4 *)&in_RDI[3].y);
  local_20 = in_RDI + 6;
  do {
    ImVec2::ImVec2(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != in_RDI + 0x12);
  memset(in_RDI,0,0xd8);
  for (local_c = 0; local_c < 0xc; local_c = local_c + 1) {
    local_10 = ((float)local_c * 2.0 * 3.1415927) / 12.0;
    _x = cosf(local_10);
    _y = sinf(local_10);
    ImVec2::ImVec2(&local_18,_x,_y);
    in_RDI[(long)local_c + 6] = local_18;
  }
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
}